

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O1

bool __thiscall
glcts::TextureCubeMapArrayStencilAttachments::readPixelsAndCompareWithExpectedResult
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  ostringstream *this_00;
  GLubyte *pGVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  uint uVar4;
  GLubyte GVar5;
  GLubyte GVar6;
  uint uVar7;
  GLuint GVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x1220))
            (0,0,this->m_cube_map_array_data[test_index].m_width,
             this->m_cube_map_array_data[test_index].m_height,0x1908,0x1401,this->m_result_data);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"Could not read pixel data from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x33d);
  GVar8 = this->m_cube_map_array_data[test_index].m_height;
  if (GVar8 == 0) {
    bVar2 = false;
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar2 = false;
    uVar4 = 0;
    do {
      bVar10 = uVar4 < GVar8 >> 1;
      GVar5 = 0xff;
      if (bVar10) {
        GVar5 = '\0';
      }
      GVar6 = '\0';
      if (bVar10) {
        GVar6 = 0xff;
      }
      if (this->m_cube_map_array_data[test_index].m_width != 0) {
        iVar3 = GVar8 * uVar4;
        pGVar1 = this->m_result_data;
        uVar7 = 0;
        uVar9 = 0;
        do {
          if ((((GVar6 != pGVar1[(ulong)uVar7 + (ulong)(uint)(iVar3 * 4)]) ||
               (GVar5 != pGVar1[(ulong)uVar7 + (ulong)(uint)(iVar3 * 4) + 1])) ||
              (GVar5 != pGVar1[(ulong)uVar7 + (ulong)(uint)(iVar3 * 4) + 2])) ||
             (GVar6 != pGVar1[(ulong)uVar7 + (ulong)(uint)(iVar3 * 4) + 3])) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Expected Data ( ",0x10);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Result Data ( ",0xe);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            bVar2 = true;
          }
          uVar9 = uVar9 + 1;
          uVar7 = uVar7 + 4;
        } while (uVar9 < this->m_cube_map_array_data[test_index].m_width);
      }
      uVar4 = uVar4 + 1;
      GVar8 = this->m_cube_map_array_data[test_index].m_height;
    } while (uVar4 < GVar8);
  }
  return bVar2;
}

Assistant:

bool TextureCubeMapArrayStencilAttachments::readPixelsAndCompareWithExpectedResult(glw::GLuint test_index)
{
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	bool				  has_test_failed = false;

	gl.readPixels(0 /* x */, 0 /* y */, m_cube_map_array_data[test_index].getWidth(),
				  m_cube_map_array_data[test_index].getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, m_result_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixel data from color buffer");

	glw::GLubyte expectedData[] = { 0, 0, 0, 0 };

	/* Loop over all pixels and compare the rendered data with reference values */
	for (glw::GLuint y = 0; y < m_cube_map_array_data[test_index].getHeight(); ++y)
	{
		/* Top half should be filled with different data than the bottom half */
		if (y >= m_cube_map_array_data[test_index].getHeight() / 2)
		{
			expectedData[0] = 0;
			expectedData[1] = 255;
			expectedData[2] = 255;
			expectedData[3] = 0;
		}
		else
		{
			expectedData[0] = 255;
			expectedData[1] = 0;
			expectedData[2] = 0;
			expectedData[3] = 255;
		}

		const glw::GLubyte* data_row =
			m_result_data + y * m_cube_map_array_data[test_index].getHeight() * m_n_cube_map_array_configurations;

		for (glw::GLuint x = 0; x < m_cube_map_array_data[test_index].getWidth(); ++x)
		{
			const glw::GLubyte* data = data_row + x * m_n_components;

			if (data[0] != expectedData[0] || data[1] != expectedData[1] || data[2] != expectedData[2] ||
				data[3] != expectedData[3])
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected Data ( " << (unsigned int)expectedData[0]
								   << "," << (unsigned int)expectedData[1] << "," << (unsigned int)expectedData[2]
								   << "," << (unsigned int)expectedData[3] << ") "
								   << "Result Data ( " << (unsigned int)data[0] << "," << (unsigned int)data[1] << ","
								   << (unsigned int)data[2] << "," << (unsigned int)data[3] << ")"
								   << tcu::TestLog::EndMessage;

				has_test_failed = true;
			}
		} /* for (all pixels in a row) */
	}	 /* for (all rows) */

	return has_test_failed;
}